

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::RootAddRef(Recycler *this,void *obj,uint *count)

{
  undefined4 *puVar1;
  StackBackTraceNode *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  uint uVar6;
  EntryType *pEVar7;
  StackBackTraceNode *pSVar8;
  StackBackTrace *pSVar9;
  undefined8 *in_FS_OFFSET;
  
  BVar5 = IsValidObject(this,obj,0);
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x23e,"(this->IsValidObject(obj))","this->IsValidObject(obj)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  if (this->transientPinnedObject != (void *)0x0) {
    pEVar7 = SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
             ::FindOrAddEntry(&this->pinnedObjectMap,this->transientPinnedObject);
    uVar6 = (pEVar7->value).refCount;
    (pEVar7->value).refCount = uVar6 + 1;
    if (uVar6 == 0) {
      this->scanPinnedObjectMap = true;
    }
    if (this->recyclerFlagsTable->LeakStackTrace == true) {
      pSVar9 = this->transientPinnedObjectStackBackTrace;
      pSVar8 = (StackBackTraceNode *)
               NoCheckHeapAllocator::Alloc
                         ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0x10);
      pSVar2 = (pEVar7->value).stackBackTraces;
      pSVar8->stackBackTrace = pSVar9;
      pSVar8->next = pSVar2;
      (pEVar7->value).stackBackTraces = pSVar8;
    }
  }
  if (count != (uint *)0x0) {
    pEVar7 = SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
             ::FindEntry(&this->pinnedObjectMap,obj);
    if (pEVar7 == (EntryType *)0x0) {
      uVar6 = 1;
    }
    else {
      uVar6 = (pEVar7->value).refCount + 1;
    }
    *count = uVar6;
  }
  this->transientPinnedObject = obj;
  if (this->recyclerFlagsTable->LeakStackTrace == true) {
    pSVar9 = StackBackTrace::Capture<Memory::NoCheckHeapAllocator>
                       ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0,0x1e);
    this->transientPinnedObjectStackBackTrace = pSVar9;
  }
  return;
}

Assistant:

void
Recycler::RootAddRef(void* obj, uint *count)
{
    Assert(this->IsValidObject(obj));

    if (transientPinnedObject)
    {
        PinRecord& refCount = pinnedObjectMap.GetReference(transientPinnedObject);
        ++refCount;
        if (refCount == 1)
        {
            this->scanPinnedObjectMap = true;
            RECYCLER_PERF_COUNTER_INC(PinnedObject);
        }
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
        if (GetRecyclerFlagsTable().LeakStackTrace)
        {
            StackBackTraceNode::Prepend(&NoCheckHeapAllocator::Instance, refCount.stackBackTraces,
                transientPinnedObjectStackBackTrace);
        }
#endif
#endif
    }

    if (count != nullptr)
    {
        PinRecord* refCount = pinnedObjectMap.TryGetReference(obj);
        *count = (refCount != nullptr) ? (*refCount + 1) : 1;
    }

    transientPinnedObject = obj;

#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
    if (GetRecyclerFlagsTable().LeakStackTrace)
    {
        transientPinnedObjectStackBackTrace = StackBackTrace::Capture(&NoCheckHeapAllocator::Instance);
    }
#endif
#endif
}